

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O3

wchar_t console_askappend(LogPolicy *lp,Filename *filename,_func_void_void_ptr_int *callback,
                         void *ctx)

{
  size_t len;
  wchar_t wVar1;
  void *buf;
  char line [32];
  termios cf;
  termios newmode;
  termios oldmode;
  byte local_e8 [36];
  termios local_c4;
  termios local_88;
  termios local_4c;
  
  premsg(&local_c4);
  if (console_batch_mode == true) {
    wVar1 = L'\0';
    fprintf(_stderr,"The session log file \"%.*s\" already exists.\nLogging will not be enabled.\n",
            0x1000,filename->path);
    fflush(_stderr);
  }
  else {
    fprintf(_stderr,
            "The session log file \"%.*s\" already exists.\nYou can overwrite it with a new session log,\nappend your session log to the end of it,\nor disable session logging for this session.\nEnter \"y\" to wipe the file, \"n\" to append to it,\nor just press Return to disable logging.\nWipe the log file? (y/n, Return cancels logging) "
            ,0x1000,filename->path);
    fflush(_stderr);
    tcgetattr(0,&local_4c);
    local_88.c_iflag = local_4c.c_iflag;
    local_88.c_oflag = local_4c.c_oflag;
    local_88.c_line = local_4c.c_line;
    local_88.c_cc[0] = local_4c.c_cc[0];
    local_88.c_cc[1] = local_4c.c_cc[1];
    local_88.c_cc[2] = local_4c.c_cc[2];
    local_88.c_cc[3] = local_4c.c_cc[3];
    local_88.c_cc[4] = local_4c.c_cc[4];
    local_88.c_cc[5] = local_4c.c_cc[5];
    local_88.c_cc[6] = local_4c.c_cc[6];
    local_88.c_cc[7] = local_4c.c_cc[7];
    local_88.c_cc[8] = local_4c.c_cc[8];
    local_88.c_cc[9] = local_4c.c_cc[9];
    local_88.c_cc[10] = local_4c.c_cc[10];
    local_88.c_cc[0xb] = local_4c.c_cc[0xb];
    local_88.c_cc[0xc] = local_4c.c_cc[0xc];
    local_88.c_cc[0xd] = local_4c.c_cc[0xd];
    local_88.c_cc[0xe] = local_4c.c_cc[0xe];
    local_88.c_cc[0xf] = local_4c.c_cc[0xf];
    local_88.c_cc[0x10] = local_4c.c_cc[0x10];
    local_88.c_cc[0x11] = local_4c.c_cc[0x11];
    local_88.c_cc[0x12] = local_4c.c_cc[0x12];
    local_88.c_cc[0x13] = local_4c.c_cc[0x13];
    local_88.c_cc[0x14] = local_4c.c_cc[0x14];
    local_88.c_cc[0x15] = local_4c.c_cc[0x15];
    local_88.c_cc[0x16] = local_4c.c_cc[0x16];
    local_88.c_ispeed = local_4c.c_ispeed;
    local_88.c_ospeed = local_4c.c_ospeed;
    local_88._8_8_ = local_4c._8_8_ | 0xb00000000;
    buf = (void *)0x0;
    tcsetattr(0,0,&local_88);
    local_e8[0] = 0;
    block_and_read((wchar_t)local_e8,buf,len);
    tcsetattr(0,0,&local_4c);
    if (stderr_is_a_tty == '\x01') {
      tcsetattr(2,1,(termios *)&local_c4);
    }
    wVar1 = L'\x02';
    if ((local_e8[0] & 0xdf) != 0x59) {
      wVar1 = (wchar_t)((local_e8[0] & 0xdf) == 0x4e);
    }
  }
  return wVar1;
}

Assistant:

int console_askappend(LogPolicy *lp, Filename *filename,
                      void (*callback)(void *ctx, int result), void *ctx)
{
    static const char msgtemplate[] =
        "The session log file \"%.*s\" already exists.\n"
        "You can overwrite it with a new session log,\n"
        "append your session log to the end of it,\n"
        "or disable session logging for this session.\n"
        "Enter \"y\" to wipe the file, \"n\" to append to it,\n"
        "or just press Return to disable logging.\n"
        "Wipe the log file? (y/n, Return cancels logging) ";

    static const char msgtemplate_batch[] =
        "The session log file \"%.*s\" already exists.\n"
        "Logging will not be enabled.\n";

    char line[32];
    struct termios cf;

    premsg(&cf);
    if (console_batch_mode) {
        fprintf(stderr, msgtemplate_batch, FILENAME_MAX, filename->path);
        fflush(stderr);
        return 0;
    }
    fprintf(stderr, msgtemplate, FILENAME_MAX, filename->path);
    fflush(stderr);

    {
        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);
    }

    postmsg(&cf);
    if (line[0] == 'y' || line[0] == 'Y')
        return 2;
    else if (line[0] == 'n' || line[0] == 'N')
        return 1;
    else
        return 0;
}